

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::interpreter::impl::auto_stack_update::~auto_stack_update(auto_stack_update *this)

{
  bool bVar1;
  reference this_00;
  bool local_11;
  auto_stack_update *this_local;
  
  bVar1 = std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::empty
                    (&this->parent_->stack_trace_);
  local_11 = false;
  if (!bVar1) {
    this_00 = std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::back
                        (&this->parent_->stack_trace_);
    local_11 = source_extend::operator==(this_00,&this->pos_);
  }
  if (local_11 == false) {
    __assert_fail("!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x4ee,"mjs::interpreter::impl::auto_stack_update::~auto_stack_update()");
  }
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::pop_back
            (&this->parent_->stack_trace_);
  source_extend::operator=(&this->parent_->current_extend_,&this->old_extend_);
  source_extend::~source_extend(&this->pos_);
  source_extend::~source_extend(&this->old_extend_);
  return;
}

Assistant:

~auto_stack_update() {
            assert(!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_);
            parent_.stack_trace_.pop_back();
            parent_.current_extend_ = old_extend_;
        }